

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capi.c
# Opt level: O2

void NGA_Set_block_cyclic_proc_grid(int g_a,int *block,int *proc_grid)

{
  Integer IVar1;
  Integer *pIVar2;
  long lVar3;
  long lVar4;
  long *plVar5;
  Integer _proc_grid [7];
  Integer _block [7];
  Integer aIStack_98 [7];
  long lStack_60;
  Integer local_58 [8];
  
  IVar1 = pnga_get_dimension((long)g_a);
  lVar4 = 0;
  lVar3 = 0;
  if (0 < IVar1) {
    lVar3 = IVar1;
  }
  plVar5 = &lStack_60 + IVar1;
  for (; lVar3 != lVar4; lVar4 = lVar4 + 1) {
    *plVar5 = (long)block[lVar4];
    plVar5 = plVar5 + -1;
  }
  pIVar2 = aIStack_98 + IVar1;
  for (lVar4 = 0; pIVar2 = pIVar2 + -1, lVar3 != lVar4; lVar4 = lVar4 + 1) {
    *pIVar2 = (long)proc_grid[lVar4];
  }
  pnga_set_block_cyclic_proc_grid((long)g_a,local_58,aIStack_98);
  return;
}

Assistant:

void NGA_Set_block_cyclic_proc_grid(int g_a, int block[], int proc_grid[])
{
    Integer aa, ndim;
    Integer _block[MAXDIM];
    Integer _proc_grid[MAXDIM];
    aa = (Integer)g_a;
    ndim = wnga_get_dimension(aa);
    COPYC2F(block,_block, ndim);
    COPYC2F(proc_grid, _proc_grid, ndim);
    wnga_set_block_cyclic_proc_grid(aa, _block, _proc_grid);
}